

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildAsmCall
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,ArgSlot argCount,RegSlot ret,
          RegSlot function,int8 returnType,ProfileId profileId)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  ValueType VVar4;
  ProfileId PVar5;
  RegSlot RVar6;
  int iVar7;
  RegOpnd *pRVar8;
  undefined4 *puVar9;
  ProfiledInstr *pPVar10;
  RegOpnd *dstOpnd_00;
  StackSym *pSVar11;
  IntConstOpnd *newSrc;
  Opnd *pOVar12;
  JITTimeFunctionBody *pJVar13;
  int local_a0;
  Instr *local_68;
  Instr *prevInstr;
  Instr *argInstr;
  int local_4c;
  int32 argOffset;
  RegSlot srcRegSlot;
  RegSlot dstRegSlot;
  Opnd *srcOpnd;
  RegOpnd *dstOpnd;
  Instr *instr;
  ArgSlot count;
  RegSlot function_local;
  RegSlot ret_local;
  ArgSlot argCount_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  instr._2_2_ = 0;
  dstOpnd = (RegOpnd *)0x0;
  srcOpnd = (Opnd *)0x0;
  local_4c = 0;
  if (newOpcode == Call) {
    RVar6 = GetRegSlotFromPtrReg(this,function);
    pRVar8 = BuildSrcOpnd(this,RVar6,TyInt64);
    RVar6 = GetRegSlotFromPtrReg(this,ret);
    dstOpnd_00 = BuildDstOpnd(this,RVar6,TyInt64);
    dstOpnd = (RegOpnd *)
              IR::Instr::New(AsmJsCallE,&dstOpnd_00->super_Opnd,&pRVar8->super_Opnd,this->m_func);
  }
  else if (newOpcode == I_Call || newOpcode == ProfiledI_Call) {
    RVar6 = GetRegSlotFromPtrReg(this,function);
    pRVar8 = BuildSrcOpnd(this,RVar6,TyInt64);
    switch(returnType) {
    case '\x01':
      RVar6 = GetRegSlotFromInt64Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TyInt64)->super_Opnd;
      VVar4 = ValueType::GetInt(false);
      IR::Opnd::SetValueType(srcOpnd,VVar4);
      break;
    case '\x02':
      RVar6 = GetRegSlotFromDoubleReg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TyFloat64)->super_Opnd;
      IR::Opnd::SetValueType(srcOpnd,ValueType::Float);
      break;
    case '\x03':
      RVar6 = GetRegSlotFromFloatReg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TyFloat32)->super_Opnd;
      IR::Opnd::SetValueType(srcOpnd,ValueType::Float);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x6f8,"((0))","(0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
      break;
    case '\n':
      RVar6 = GetRegSlotFromIntReg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TyInt32)->super_Opnd;
      VVar4 = ValueType::GetInt(false);
      IR::Opnd::SetValueType(srcOpnd,VVar4);
      break;
    case '\r':
      break;
    case '\x0e':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128I4)->super_Opnd;
      break;
    case '\x0f':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128U4)->super_Opnd;
      break;
    case '\x10':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128I8)->super_Opnd;
      break;
    case '\x11':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128I16)->super_Opnd;
      break;
    case '\x12':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128U8)->super_Opnd;
      break;
    case '\x13':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128U16)->super_Opnd;
      break;
    case '\x14':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128B4)->super_Opnd;
      break;
    case '\x15':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128B8)->super_Opnd;
      break;
    case '\x16':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128B16)->super_Opnd;
      break;
    case '\x17':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128F4)->super_Opnd;
      break;
    case '\x18':
      RVar6 = GetRegSlotFromSimd128Reg(this,ret);
      srcOpnd = &BuildDstOpnd(this,RVar6,TySimd128D2)->super_Opnd;
    }
    if (profileId == 0xffff) {
      dstOpnd = (RegOpnd *)IR::Instr::New(AsmJsCallI,srcOpnd,&pRVar8->super_Opnd,this->m_func);
    }
    else {
      if (newOpcode != ProfiledI_Call) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x702,"(newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)",
                           "newOpcode == Js::OpCodeAsmJs::ProfiledI_Call");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      dstOpnd = (RegOpnd *)
                IR::ProfiledInstr::New(AsmJsCallI,srcOpnd,&pRVar8->super_Opnd,this->m_func);
      pJVar13 = Func::GetJITFunctionBody(this->m_func);
      PVar5 = JITTimeFunctionBody::GetProfiledCallSiteCount(pJVar13);
      if (PVar5 <= profileId) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x704,
                           "(profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount())",
                           "profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pPVar10 = IR::Instr::AsProfiledInstr((Instr *)dstOpnd);
      *(uint *)&pPVar10->u = (uint)profileId;
    }
    bVar2 = SListBase<int,_Memory::ArenaAllocator,_RealCount>::Empty
                      (&this->m_argOffsetStack->
                        super_SListBase<int,_Memory::ArenaAllocator,_RealCount>);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x708,"(!this->m_argOffsetStack->Empty())",
                         "!this->m_argOffsetStack->Empty()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    local_4c = SList<int,_Memory::ArenaAllocator,_RealCount>::Pop(this->m_argOffsetStack);
    local_4c = local_4c + -8;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x717,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  AddInstr(this,(Instr *)dstOpnd,offset);
  local_68 = (Instr *)dstOpnd;
  bVar2 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    ((SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this->m_argStack);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x71e,"(!this->m_argStack->Empty())","!this->m_argStack->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  prevInstr = SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Pop
                        (&this->m_argStack->
                          super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  while( true ) {
    bVar3 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                      ((SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this->m_argStack
                      );
    bVar2 = false;
    if (!bVar3) {
      bVar2 = prevInstr->m_opcode != StartCall;
    }
    if (!bVar2) break;
    if ((newOpcode == I_Call) || (newOpcode == ProfiledI_Call)) {
      pOVar12 = IR::Instr::GetDst(prevInstr);
      iVar7 = IR::Opnd::GetSize(pOVar12);
      if (iVar7 < 9) {
        local_a0 = 8;
      }
      else {
        pOVar12 = IR::Instr::GetDst(prevInstr);
        local_a0 = IR::Opnd::GetSize(pOVar12);
      }
      local_4c = local_4c - local_a0;
      pOVar12 = IR::Instr::GetDst(prevInstr);
      pSVar11 = IR::Opnd::GetStackSym(pOVar12);
      pSVar11->m_offset = local_4c;
    }
    pOVar12 = IR::Instr::GetDst(prevInstr);
    IR::Instr::SetSrc2(local_68,pOVar12);
    local_68 = prevInstr;
    instr._2_2_ = instr._2_2_ + 1;
    prevInstr = SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Pop
                          (&this->m_argStack->
                            super_SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  }
  if (prevInstr->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x733,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                       "argInstr->m_opcode == Js::OpCode::StartCall");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  newSrc = IR::IntConstOpnd::New((ulong)instr._2_2_,TyUint16,this->m_func,false);
  IR::Instr::SetSrc1(prevInstr,&newSrc->super_Opnd);
  if (local_4c != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x736,"(argOffset == 0)","argOffset == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pOVar12 = IR::Instr::GetDst(prevInstr);
  IR::Instr::SetSrc2(local_68,pOVar12);
  if (this->m_func->m_argSlotsForFunctionsCalled < (uint)argCount) {
    this->m_func->m_argSlotsForFunctionsCalled = (uint)argCount;
  }
  bVar2 = AsmJsJITInfo::UsesHeapBuffer(this->m_asmFuncInfo);
  if (bVar2) {
    pJVar13 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::IsWasmFunction(pJVar13);
    if (bVar2) {
      BuildHeapBufferReload(this,offset,false);
    }
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmCall(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::ArgSlot argCount, Js::RegSlot ret, Js::RegSlot function, int8 returnType, Js::ProfileId profileId)
{
    Js::ArgSlot count = 0;

    IR::Instr * instr = nullptr;
    IR::RegOpnd * dstOpnd = nullptr;
    IR::Opnd * srcOpnd = nullptr;
    Js::RegSlot dstRegSlot;
    Js::RegSlot srcRegSlot;
    int32 argOffset = 0;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::I_Call:
    case Js::OpCodeAsmJs::ProfiledI_Call:
        srcRegSlot = GetRegSlotFromPtrReg(function);
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyMachReg);

        switch ((Js::AsmJsRetType::Which)returnType)
        {
        case Js::AsmJsRetType::Which::Signed:
            dstRegSlot = GetRegSlotFromIntReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
            dstOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Float:
            dstRegSlot = GetRegSlotFromFloatReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat32);
            dstOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Double:
            dstRegSlot = GetRegSlotFromDoubleReg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyFloat64);
            dstOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Int64:
            dstRegSlot = GetRegSlotFromInt64Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
            dstOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Void:
            break;

#ifdef ENABLE_WASM_SIMD
        case Js::AsmJsRetType::Which::Float32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128F4);
            break;
        case Js::AsmJsRetType::Which::Int32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I4);
            break;
        case Js::AsmJsRetType::Which::Bool32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B4);
            break;
        case Js::AsmJsRetType::Which::Bool16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B8);
            break;
        case Js::AsmJsRetType::Which::Bool8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128B16);
            break;
        case Js::AsmJsRetType::Which::Float64x2:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128D2);
            break;
        case Js::AsmJsRetType::Which::Int16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I8);
            break;
        case Js::AsmJsRetType::Which::Int8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128I16);
            break;
        case Js::AsmJsRetType::Which::Uint32x4:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U4);
            break;
        case Js::AsmJsRetType::Which::Uint16x8:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U8);
            break;
        case Js::AsmJsRetType::Which::Uint8x16:
            dstRegSlot = GetRegSlotFromSimd128Reg(ret);
            dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U16);
            break;
#endif
        default:
            Assume(UNREACHED);
        }

        {
            if (profileId == Js::Constants::NoProfileId)
            {
                instr = IR::Instr::New(Js::OpCode::AsmJsCallI, dstOpnd, srcOpnd, m_func);
            }
            else
            {
                Assert(newOpcode == Js::OpCodeAsmJs::ProfiledI_Call);
                instr = IR::ProfiledInstr::New(Js::OpCode::AsmJsCallI, dstOpnd, srcOpnd, m_func);
                AssertOrFailFast(profileId < m_func->GetJITFunctionBody()->GetProfiledCallSiteCount());
                instr->AsProfiledInstr()->u.profileId = profileId;
            }
        }
        AssertOrFailFast(!this->m_argOffsetStack->Empty());
        argOffset = m_argOffsetStack->Pop();
        argOffset -= MachPtr;
        break;

    case Js::OpCodeAsmJs::Call:
        srcRegSlot = GetRegSlotFromPtrReg(function);
        srcOpnd = BuildSrcOpnd(srcRegSlot, TyMachReg);

        dstRegSlot = GetRegSlotFromPtrReg(ret);
        dstOpnd = BuildDstOpnd(dstRegSlot, TyMachReg);

        instr = IR::Instr::New(Js::OpCode::AsmJsCallE, dstOpnd, srcOpnd, m_func);
        break;
    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);

    IR::Instr * argInstr = nullptr;
    IR::Instr * prevInstr = instr;

    AssertOrFailFast(!this->m_argStack->Empty());
    for (argInstr = m_argStack->Pop(); !m_argStack->Empty() && argInstr->m_opcode != Js::OpCode::StartCall; argInstr = m_argStack->Pop())
    {
        if (newOpcode == Js::OpCodeAsmJs::I_Call || newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)
        {
#if _M_IX86
            argOffset -= argInstr->GetDst()->GetSize();
#elif _M_X64
            argOffset -= (argInstr->GetDst()->GetSize() <= MachPtr ? MachPtr : argInstr->GetDst()->GetSize());
#else
            Assert(UNREACHED);
#endif
            argInstr->GetDst()->GetStackSym()->m_offset = argOffset;

        }
        // associate the ArgOuts with this call via src2
        prevInstr->SetSrc2(argInstr->GetDst());
        prevInstr = argInstr;
        count++;
    }

    AssertOrFailFast(argInstr->m_opcode == Js::OpCode::StartCall);
    argInstr->SetSrc1(IR::IntConstOpnd::New(count, TyUint16, m_func));

    AssertOrFailFast(argOffset == 0);
    prevInstr->SetSrc2(argInstr->GetDst());

    // todo:: are we sure we don't need this for wasm ?
#ifdef ENABLE_SIMDJS
#if defined(_M_X64)
    // Without SIMD vars, all args are Var in size. So offset in Var = arg position in args list.
    // With SIMD, args have variable size, so we need to track argument position in the args list to be able to assign arg register for first four args on x64.
    if (m_func->IsSIMDEnabled())
    {
        for (uint i = 1; !m_tempList->Empty(); i++)
        {
            IR::Instr * instrArg = m_tempList->Pop();
            // record argument position and make room for implicit args
            instrArg->GetDst()->GetStackSym()->m_argPosition = i;
            if (newOpcode == Js::OpCodeAsmJs::I_Call || newOpcode == Js::OpCodeAsmJs::ProfiledI_Call)
            {
                // implicit func obj arg
                instrArg->GetDst()->GetStackSym()->m_argPosition += 1;
            }
            else
            {
                // implicit func obj + callInfo args
                Assert(newOpcode == Js::OpCodeAsmJs::Call);
                instrArg->GetDst()->GetStackSym()->m_argPosition += 2;
            }
        }
    }
#endif
#endif
    if (m_func->m_argSlotsForFunctionsCalled < argCount)
    {
        m_func->m_argSlotsForFunctionsCalled = argCount;
    }
#ifdef ENABLE_WASM
    // heap buffer can change for wasm
    if (m_asmFuncInfo->UsesHeapBuffer() && m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        BuildHeapBufferReload(offset);
    }
#endif
}